

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_footprints.cpp
# Opt level: O1

void __thiscall
cp::PlanFootprints::init_setup
          (PlanFootprints *this,Affine3d *init_leg_pose,Quat *waist_q,Vector3 *com,double *endcpoff)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  Scalar SVar4;
  long lVar5;
  PlanFootprints *pPVar6;
  uint uVar7;
  SrcEvaluatorType srcEvaluator_1;
  Matrix<double,_3,_3,_0,_3,_3> *pMVar8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this_00;
  uint uVar9;
  undefined1 *puVar10;
  char *__function;
  PlanFootprints *pPVar11;
  long lVar12;
  ulong uVar13;
  PlanFootprints *pPVar14;
  undefined1 *puVar15;
  Transform<double,3,2,0> *this_01;
  PlanFootprints *pPVar16;
  ulong uVar17;
  PlanFootprints *pPVar18;
  long lVar19;
  ulong uVar20;
  LinearMatrixType result;
  Quat q;
  Vector3 trans;
  undefined1 local_120 [32];
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  Scalar local_d8;
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  Scalar local_b8 [3];
  double *local_a0;
  Quat *local_98;
  Vector3 *local_90;
  PlanFootprints *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  PlanFootprints *local_70;
  PlanFootprints *local_68;
  Affine3d *local_60;
  Transform<double,3,2,0> *local_58;
  undefined8 local_50;
  Scalar local_48;
  undefined8 uStack_40;
  
  pPVar14 = this + 0x340;
  pPVar11 = this + 0x4d8;
  lVar12 = 0;
  this_01 = (Transform<double,3,2,0> *)init_leg_pose;
  pPVar16 = pPVar14;
  pPVar18 = pPVar11;
  local_a0 = endcpoff;
  local_98 = waist_q;
  local_90 = com;
  local_88 = this;
  local_70 = pPVar11;
  local_68 = pPVar14;
  local_60 = init_leg_pose;
  do {
    if (((ulong)init_leg_pose & 0xf) != 0) {
      __assert_fail("((internal::UIntPtr(block.data()) % (((int)1 >= (int)evaluator<XprType>::Alignment) ? (int)1 : (int)evaluator<XprType>::Alignment)) == 0) && \"data is not aligned\""
                    ,"/usr/include/eigen3/Eigen/src/Core/CoreEvaluators.h",0x4ca,
                    "Eigen::internal::block_evaluator<const Eigen::Matrix<double, 4, 4>, 3, 1, true>::block_evaluator(const XprType &) [ArgType = const Eigen::Matrix<double, 4, 4>, BlockRows = 3, BlockCols = 1, InnerPanel = true, HasDirectAccess = true]"
                   );
    }
    local_b8[0] = *(Scalar *)(this_01 + 0x60);
    local_b8[1] = *(Scalar *)(this_01 + 0x68);
    local_b8[2] = *(Scalar *)(this_01 + 0x70);
    local_58 = this_01;
    local_50 = local_b8[2];
    local_48 = local_b8[0];
    uStack_40 = local_b8[1];
    Eigen::Transform<double,3,2,0>::
    computeRotationScaling<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
              (this_01,(Matrix<double,_3,_3,_0,_3,_3> *)local_120,
               (Matrix<double,_3,_3,_0,_3,_3> *)0x0);
    dVar2 = local_100 + local_e0 + (double)local_120._0_8_;
    if (dVar2 <= 0.0) {
      uVar13 = (ulong)((double)local_120._0_8_ < local_100);
      pMVar8 = (Matrix<double,_3,_3,_0,_3,_3> *)local_120;
      if ((double)local_120._0_8_ < local_100) {
        pMVar8 = (Matrix<double,_3,_3,_0,_3,_3> *)(local_120 + 0x18);
      }
      pdVar1 = (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>).m_storage.
               m_data.array + uVar13;
      if (*pdVar1 <= local_e0 && local_e0 != *pdVar1) {
        uVar13 = 2;
      }
      lVar19 = 0;
      if (uVar13 + 1 != 3) {
        lVar19 = uVar13 + 1;
      }
      uVar17 = lVar19 + ((lVar19 + 1U) / 3) * -3 + 1;
      puVar10 = local_120 + uVar13 * 0x18;
      puVar15 = local_120 + lVar19 * 0x18;
      lVar5 = uVar17 * 0x18 + -0x120;
      dVar2 = ((*(double *)(puVar10 + uVar13 * 8) - *(double *)(puVar15 + lVar19 * 8)) -
              *(double *)(local_120 + (uVar17 & 0xffffffff) * 8 + lVar5 + 0x120)) + 1.0;
      if (dVar2 < 0.0) {
        local_80 = puVar15;
        local_78 = puVar10;
        dVar2 = sqrt(dVar2);
        puVar10 = local_78;
        puVar15 = local_80;
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar3 = 0.5 / dVar2;
      uVar13 = (ulong)(uint)((int)uVar13 << 3);
      *(double *)((long)&local_d8 + uVar13) = dVar2 * 0.5;
      uVar20 = (ulong)(uint)((int)lVar19 << 3);
      dStack_c0 = (*(double *)(puVar15 + uVar17 * 8) -
                  *(double *)(local_120 + uVar20 + lVar5 + 0x120)) * dVar3;
      *(double *)((long)&local_d8 + uVar20) =
           (*(double *)(puVar10 + uVar20) + *(double *)(puVar15 + uVar13)) * dVar3;
      (&local_d8)[uVar17] =
           (*(double *)(puVar10 + uVar17 * 8) + *(double *)(local_120 + uVar13 + lVar5 + 0x120)) *
           dVar3;
      pPVar14 = local_68;
      init_leg_pose = local_60;
      pPVar18 = local_70;
    }
    else {
      dVar2 = dVar2 + 1.0;
      if (dVar2 < 0.0) {
        dVar2 = sqrt(dVar2);
      }
      else {
        dVar2 = SQRT(dVar2);
      }
      dVar3 = 0.5 / dVar2;
      dStack_c0 = dVar2 * 0.5;
      local_d8 = (local_f8 - local_e8) * dVar3;
      dStack_d0 = (local_f0 - (double)local_120._16_8_) * dVar3;
      local_c8 = ((double)local_120._8_8_ - (double)local_120._24_8_) * dVar3;
    }
    pPVar6 = local_88;
    uVar7 = (uint)pPVar11 & 8;
    *(Scalar *)(pPVar16 + -0x30) = local_48;
    *(undefined8 *)(pPVar16 + -0x28) = uStack_40;
    *(undefined8 *)(pPVar16 + -0x20) = local_50;
    *(Scalar *)(pPVar16 + -0x10) = local_d8;
    *(double *)(pPVar16 + -8) = dStack_d0;
    *(double *)pPVar16 = local_c8;
    *(double *)(pPVar16 + 8) = dStack_c0;
    *(Scalar *)(pPVar16 + -0x330) = local_48;
    *(undefined8 *)(pPVar16 + -0x328) = uStack_40;
    *(undefined8 *)(pPVar16 + -800) = local_50;
    *(Scalar *)(pPVar16 + -0x310) = local_d8;
    *(double *)(pPVar16 + -0x308) = dStack_d0;
    *(double *)(pPVar16 + -0x300) = local_c8;
    *(double *)(pPVar16 + -0x2f8) = dStack_c0;
    uVar9 = (uint)((int)lVar12 + (int)pPVar18) >> 3 & 1;
    if (uVar9 == 0) {
      SVar4 = local_b8[(ulong)uVar9 + 1];
      *(Scalar *)(pPVar18 + lVar12 + (ulong)uVar7) = local_b8[uVar9];
      *(Scalar *)(pPVar18 + lVar12 + (ulong)uVar7 + 8) = SVar4;
      *(undefined8 *)(pPVar14 + lVar12 + 0x1a8) = local_50;
    }
    else {
      *(Scalar *)(pPVar14 + lVar12 + 0x198) = local_b8[0];
      SVar4 = local_b8[(ulong)uVar9 + 1];
      *(Scalar *)(pPVar18 + lVar12 + (ulong)uVar7) = local_b8[uVar9];
      *(Scalar *)(pPVar18 + lVar12 + (ulong)uVar7 + 8) = SVar4;
    }
    lVar12 = lVar12 + 0x18;
    pPVar11 = pPVar11 + 0x18;
    pPVar16 = pPVar16 + 0xe0;
    this_01 = local_58 + 0x80;
  } while (lVar12 == 0x18);
  dVar2 = (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
          array[1];
  *(double *)(local_88 + 0x1d0) =
       (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  *(double *)(local_88 + 0x1d8) = dVar2;
  *(double *)(local_88 + 0x1e0) =
       (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[2];
  dVar2 = (local_98->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[1];
  *(double *)(local_88 + 0x1f0) =
       (local_98->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[0];
  *(double *)(local_88 + 0x1f8) = dVar2;
  dVar2 = (local_98->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
          m_storage.m_data.array[3];
  *(double *)(local_88 + 0x200) =
       (local_98->m_coeffs).super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
       m_data.array[2];
  *(double *)(local_88 + 0x208) = dVar2;
  local_120._0_8_ = local_88 + 0x2d0;
  local_120._8_8_ = 0.0;
  local_120._16_8_ = 4.94065645841247e-324;
  local_120._24_8_ = 4.94065645841247e-324;
  *(double *)(local_88 + 0x2d0) =
       (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.m_data.
       array[0];
  Eigen::CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>::operator_
            ((CommaInitializer<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)local_120,
             (local_90->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
             m_data.array + 1);
  if ((local_120._24_8_ + local_120._8_8_ == 2) &&
     ((double)local_120._16_8_ == 4.94065645841247e-324)) {
    *(double *)(pPVar6 + 0x508) = *local_a0;
    *(double *)(pPVar6 + 0x510) = local_a0[1];
    local_120._0_8_ = pPVar6 + 0x2e8;
    local_120._8_8_ = 0.0;
    local_120._16_8_ = 4.94065645841247e-324;
    local_120._24_8_ = 4.94065645841247e-324;
    *(undefined8 *)(pPVar6 + 0x2e8) = 0;
    local_d8 = 0.0;
    this_00 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                        ((CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_120,
                         &local_d8);
    local_b8[0] = 0.0;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(this_00,local_b8);
    if ((local_120._24_8_ + local_120._8_8_ == 3) &&
       ((double)local_120._16_8_ == 4.94065645841247e-324)) {
      *(undefined8 *)(pPVar6 + 0x300) = 0;
      *(undefined4 *)(pPVar6 + 0x4d0) = 0;
      return;
    }
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 3, 1>>::finished() [MatrixType = Eigen::Matrix<double, 3, 1>]"
    ;
  }
  else {
    __function = 
    "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 2, 1>>::finished() [MatrixType = Eigen::Matrix<double, 2, 1>]"
    ;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,__function);
}

Assistant:

void PlanFootprints::init_setup(const Affine3d init_leg_pose[],
                                const Quat& waist_q, const Vector3& com,
                                const double endcpoff[]) {
  for (int i = 0; i < 2; ++i) {
    Vector3 trans = init_leg_pose[i].translation();
    Quat q(init_leg_pose[i].rotation());
    init_feet_pose[i].set(trans, q);
    ref_land_pose[i].set(init_feet_pose[i]);
    dist_body2foot[i] << trans;  // TODO! subtraction to body position
  }
  ref_waist_pose.set(com, waist_q);
  // ref_waist_r = waist_r;
  end_cp << com[0], com[1];
  end_cp_offset[0] = endcpoff[0];  end_cp_offset[1] = endcpoff[1];
  step_vector << 0.0, 0.0, 0.0;
  step_angle = 0.0;
  step_num = 0;
}